

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

GLenum gl4cts::CopyImage::Utils::transProxyToRealTarget(GLenum target)

{
  if ((int)target < 0x8c19) {
    if ((int)target < 0x8070) {
      if (target == 0x8063) {
        return 0xde0;
      }
      if (target == 0x8064) {
        return 0xde1;
      }
    }
    else {
      if (target == 0x8070) {
        return 0x806f;
      }
      if (target == 0x84f7) {
        target = 0x84f5;
      }
      else if (target == 0x851b) {
        return 0x8513;
      }
    }
  }
  else if ((int)target < 0x900b) {
    if (target == 0x8c19) {
      return 0x8c18;
    }
    if (target == 0x8c1b) {
      return 0x8c1a;
    }
  }
  else {
    if (target == 0x900b) {
      return 0x9009;
    }
    if (target == 0x9101) {
      return 0x9100;
    }
    if (target == 0x9103) {
      return 0x9102;
    }
  }
  return target;
}

Assistant:

GLenum Utils::transProxyToRealTarget(GLenum target)
{
	switch (target)
	{
	case GL_PROXY_TEXTURE_1D:
		target = GL_TEXTURE_1D;
		break;
	case GL_PROXY_TEXTURE_1D_ARRAY:
		target = GL_TEXTURE_1D_ARRAY;
		break;
	case GL_PROXY_TEXTURE_2D:
		target = GL_TEXTURE_2D;
		break;
	case GL_PROXY_TEXTURE_2D_ARRAY:
		target = GL_TEXTURE_2D_ARRAY;
		break;
	case GL_PROXY_TEXTURE_2D_MULTISAMPLE:
		target = GL_TEXTURE_2D_MULTISAMPLE;
		break;
	case GL_PROXY_TEXTURE_2D_MULTISAMPLE_ARRAY:
		target = GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		break;
	case GL_PROXY_TEXTURE_3D:
		target = GL_TEXTURE_3D;
		break;
	case GL_PROXY_TEXTURE_CUBE_MAP:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_PROXY_TEXTURE_CUBE_MAP_ARRAY:
		target = GL_TEXTURE_CUBE_MAP_ARRAY;
		break;
	case GL_PROXY_TEXTURE_RECTANGLE:
		target = GL_TEXTURE_RECTANGLE;
		break;
	default:
		break;
	}

	return target;
}